

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getInteratomicVector
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int atom1,int atom2)

{
  Snapshot *this_00;
  pointer pVVar1;
  long lVar2;
  Vector<double,_3U> result;
  double local_28 [4];
  
  this_00 = (this->super_ForceDecomposition).snap_;
  pVVar1 = (this_00->atomData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar2 = 0;
  do {
    local_28[lVar2] =
         *(double *)((long)(pVVar1 + atom2) + lVar2 * 8) -
         *(double *)((long)(pVVar1 + atom1) + lVar2 * 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_28[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_28[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_28[1];
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector(this_00,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getInteratomicVector(int atom1,
                                                          int atom2) {
    Vector3d d;

#ifdef IS_MPI
    d = atomColData.position[atom2] - atomRowData.position[atom1];
#else
    d = snap_->atomData.position[atom2] - snap_->atomData.position[atom1];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }